

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createB2S(IRBuilder *this,Value *rhs,string *name)

{
  bool bVar1;
  LiteralType LVar2;
  char *__s;
  ConstantValue<bool,_(flow::LiteralType)1> *local_a0;
  string local_88;
  LiteralType local_68 [5];
  allocator<char> local_51;
  string local_50;
  ConstantValue<bool,_(flow::LiteralType)1> *local_30;
  ConstantBoolean *a;
  string *name_local;
  Value *rhs_local;
  IRBuilder *this_local;
  
  a = (ConstantBoolean *)name;
  name_local = (string *)rhs;
  rhs_local = (Value *)this;
  LVar2 = Value::type(rhs);
  if (LVar2 == Boolean) {
    if (name_local == (string *)0x0) {
      local_a0 = (ConstantValue<bool,_(flow::LiteralType)1> *)0x0;
    }
    else {
      local_a0 = (ConstantValue<bool,_(flow::LiteralType)1> *)
                 __dynamic_cast(name_local,&Value::typeinfo,
                                &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    }
    local_30 = local_a0;
    if (local_a0 == (ConstantValue<bool,_(flow::LiteralType)1> *)0x0) {
      local_68[0] = String;
      makeName(&local_88,this,(string *)a);
      this_local = (IRBuilder *)
                   insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                             (this,local_68,(Value **)&name_local,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      bVar1 = ConstantValue<bool,_(flow::LiteralType)1>::get(local_a0);
      __s = "false";
      if (bVar1) {
        __s = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      this_local = (IRBuilder *)get(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    return (Value *)this_local;
  }
  __assert_fail("rhs->type() == LiteralType::Boolean",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x23d,"Value *flow::IRBuilder::createB2S(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createB2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return get(a->get() ? "true" : "false");

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}